

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O1

uintptr_t ngx_radix128tree_find(ngx_radix_tree_t *tree,u_char *key)

{
  uint uVar1;
  uintptr_t uVar2;
  ngx_radix_node_t *pnVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  pnVar3 = tree->root;
  if (pnVar3 != (ngx_radix_node_t *)0x0) {
    uVar2 = 0xffffffffffffffff;
    lVar4 = 0;
    uVar5 = 0x80;
    do {
      if (pnVar3->value != 0xffffffffffffffff) {
        uVar2 = pnVar3->value;
      }
      uVar1 = uVar5 & key[lVar4];
      uVar6 = uVar5 >> 1;
      uVar5 = uVar6;
      if (uVar6 == 0) {
        uVar5 = 0x80;
      }
      lVar4 = lVar4 + (ulong)(uVar6 == 0);
      pnVar3 = (&pnVar3->right)[uVar1 == 0];
    } while (pnVar3 != (ngx_radix_node_t *)0x0);
    return uVar2;
  }
  return 0xffffffffffffffff;
}

Assistant:

uintptr_t
ngx_radix128tree_find(ngx_radix_tree_t *tree, u_char *key)
{
    u_char             bit;
    uintptr_t          value;
    ngx_uint_t         i;
    ngx_radix_node_t  *node;

    i = 0;
    bit = 0x80;
    value = NGX_RADIX_NO_VALUE;
    node = tree->root;

    while (node) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            value = node->value;
        }

        if (key[i] & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;

        if (bit == 0) {
            i++;
            bit = 0x80;
        }
    }

    return value;
}